

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

bool __thiscall
Catch::Matchers::StringEqualsMatcher::match(StringEqualsMatcher *this,string *source)

{
  int iVar1;
  bool bVar2;
  string local_30;
  
  CasedString::adjustString(&local_30,&(this->super_StringMatcherBase).m_comparator,source);
  if (local_30._M_string_length ==
      (this->super_StringMatcherBase).m_comparator.m_str._M_string_length) {
    if (local_30._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_30._M_dataplus._M_p,
                   (this->super_StringMatcherBase).m_comparator.m_str._M_dataplus._M_p,
                   local_30._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool StringEqualsMatcher::match(std::string const &source) const {
            return m_comparator.adjustString(source) == m_comparator.m_str;
        }